

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

bool __thiscall smf::MidiFile::readSmf(MidiFile *this,istream *input)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ostream *poVar7;
  ulong uVar8;
  void *pvVar9;
  reference ppMVar10;
  MidiEventList *pMVar11;
  reference pvVar12;
  int local_dc;
  int local_d8;
  int absticks;
  int i;
  int xstatus;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  MidiEvent event;
  int iStack_78;
  uchar runningCommand;
  int subframes;
  int framespersecond;
  int z;
  int tracks;
  int type;
  int iStack_60;
  ushort shortdata;
  ulong longdata;
  int character;
  allocator local_41;
  string local_40 [8];
  string filename;
  istream *input_local;
  MidiFile *this_local;
  
  this->m_rwstatus = true;
  filename.field_2._8_8_ = input;
  pcVar6 = getFilename(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar6,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  iVar4 = std::istream::get();
  if (iVar4 == -1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"In file ");
    poVar7 = std::operator<<(poVar7,local_40);
    poVar7 = std::operator<<(poVar7,": unexpected end of file.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cerr,
                             "Expecting \'M\' at first byte, but found nothing.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    this->m_rwstatus = false;
    this_local._7_1_ = (bool)(this->m_rwstatus & 1);
  }
  else if (iVar4 == 0x4d) {
    iVar4 = std::istream::get();
    if (iVar4 == -1) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"In file ");
      poVar7 = std::operator<<(poVar7,local_40);
      poVar7 = std::operator<<(poVar7,": unexpected end of file.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "Expecting \'T\' at second byte, but found nothing.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      this->m_rwstatus = false;
      this_local._7_1_ = (bool)(this->m_rwstatus & 1);
    }
    else if (iVar4 == 0x54) {
      iVar4 = std::istream::get();
      if (iVar4 == -1) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"In file ");
        poVar7 = std::operator<<(poVar7,local_40);
        poVar7 = std::operator<<(poVar7,": unexpected end of file.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "Expecting \'h\' at third byte, but found nothing.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        this->m_rwstatus = false;
        this_local._7_1_ = (bool)(this->m_rwstatus & 1);
      }
      else if (iVar4 == 0x68) {
        iVar4 = std::istream::get();
        if (iVar4 == -1) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"In file ");
          poVar7 = std::operator<<(poVar7,local_40);
          poVar7 = std::operator<<(poVar7,": unexpected end of file.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Expecting \'d\' at fourth byte, but found nothing.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          this->m_rwstatus = false;
          this_local._7_1_ = (bool)(this->m_rwstatus & 1);
        }
        else if (iVar4 == 100) {
          uVar8 = readLittleEndian4Bytes((istream *)filename.field_2._8_8_);
          if (uVar8 == 6) {
            uVar3 = readLittleEndian2Bytes((istream *)filename.field_2._8_8_);
            if (uVar3 == 0) {
              bVar1 = false;
            }
            else {
              if (uVar3 != 1) {
                poVar7 = std::operator<<((ostream *)&std::cerr,"Error: cannot handle a type-");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar3);
                poVar7 = std::operator<<(poVar7," MIDI file");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                this->m_rwstatus = false;
                this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                goto LAB_0014c5d3;
              }
              bVar1 = true;
            }
            uVar3 = readLittleEndian2Bytes((istream *)filename.field_2._8_8_);
            if ((bVar1) || (uVar3 == 1)) {
              uVar5 = (uint)uVar3;
              clear(this);
              ppMVar10 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                         operator[](&this->m_events,0);
              if (*ppMVar10 != (value_type)0x0) {
                ppMVar10 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,0);
                pMVar11 = *ppMVar10;
                if (pMVar11 != (MidiEventList *)0x0) {
                  MidiEventList::~MidiEventList(pMVar11);
                  operator_delete(pMVar11);
                }
              }
              std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                        (&this->m_events,(long)(int)uVar5);
              for (subframes = 0; subframes < (int)uVar5; subframes = subframes + 1) {
                pMVar11 = (MidiEventList *)operator_new(0x18);
                MidiEventList::MidiEventList(pMVar11);
                ppMVar10 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)subframes);
                *ppMVar10 = pMVar11;
                ppMVar10 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)subframes);
                MidiEventList::reserve(*ppMVar10,10000);
                ppMVar10 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)subframes);
                MidiEventList::clear(*ppMVar10);
              }
              uVar3 = readLittleEndian2Bytes((istream *)filename.field_2._8_8_);
              if (uVar3 < 0x8000) {
                this->m_ticksPerQuarterNote = (uint)uVar3;
              }
              else {
                type._3_1_ = (byte)(uVar3 >> 8);
                iStack_78 = -(uint)type._3_1_ + 0x100;
                type._2_1_ = (byte)uVar3;
                event.m_eventlink._4_4_ = (uint)type._2_1_;
                switch(-(uint)type._3_1_) {
                case 0xffffff18:
                  iStack_78 = 0x18;
                  break;
                case 0xffffff19:
                  iStack_78 = 0x19;
                  break;
                default:
                  poVar7 = std::operator<<((ostream *)&std::cerr,"Warning: unknown FPS: ");
                  pvVar9 = (void *)std::ostream::operator<<(poVar7,iStack_78);
                  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
                  poVar7 = std::operator<<((ostream *)&std::cerr,"Using non-standard FPS: ");
                  pvVar9 = (void *)std::ostream::operator<<(poVar7,iStack_78);
                  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
                  break;
                case 0xffffff1d:
                  iStack_78 = 0x1d;
                  break;
                case 0xffffff1e:
                  iStack_78 = 0x1e;
                }
                this->m_ticksPerQuarterNote = iStack_78 * event.m_eventlink._4_4_;
              }
              MidiEvent::MidiEvent
                        ((MidiEvent *)
                         &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
              for (local_d8 = 0; local_d8 < (int)uVar5; local_d8 = local_d8 + 1) {
                event.m_eventlink._3_1_ = 0;
                iVar4 = std::istream::get();
                if (iVar4 == -1) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"In file ");
                  poVar7 = std::operator<<(poVar7,local_40);
                  poVar7 = std::operator<<(poVar7,": unexpected end of file.");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  poVar7 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'M\' at first byte in track, but found nothing."
                                          );
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                  goto LAB_0014c5bb;
                }
                if (iVar4 != 0x4d) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
                  poVar7 = std::operator<<(poVar7,local_40);
                  poVar7 = std::operator<<(poVar7," is not a MIDI file");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  poVar7 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'M\' at first byte in track but got \'");
                  longdata._0_1_ = (char)iVar4;
                  poVar7 = std::operator<<(poVar7,(char)longdata);
                  poVar7 = std::operator<<(poVar7,"\'");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                  goto LAB_0014c5bb;
                }
                iVar4 = std::istream::get();
                if (iVar4 == -1) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"In file ");
                  poVar7 = std::operator<<(poVar7,local_40);
                  poVar7 = std::operator<<(poVar7,": unexpected end of file.");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  poVar7 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'T\' at second byte in track, but found nothing."
                                          );
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                  goto LAB_0014c5bb;
                }
                if (iVar4 != 0x54) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
                  poVar7 = std::operator<<(poVar7,local_40);
                  poVar7 = std::operator<<(poVar7," is not a MIDI file");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  poVar7 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'T\' at second byte in track but got \'");
                  longdata._0_1_ = (char)iVar4;
                  poVar7 = std::operator<<(poVar7,(char)longdata);
                  poVar7 = std::operator<<(poVar7,"\'");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                  goto LAB_0014c5bb;
                }
                iVar4 = std::istream::get();
                if (iVar4 == -1) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"In file ");
                  poVar7 = std::operator<<(poVar7,local_40);
                  poVar7 = std::operator<<(poVar7,": unexpected end of file.");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  poVar7 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'r\' at third byte in track, but found nothing."
                                          );
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                  goto LAB_0014c5bb;
                }
                if (iVar4 != 0x72) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
                  poVar7 = std::operator<<(poVar7,local_40);
                  poVar7 = std::operator<<(poVar7," is not a MIDI file");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  poVar7 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'r\' at third byte in track but got \'");
                  longdata._0_1_ = (char)iVar4;
                  poVar7 = std::operator<<(poVar7,(char)longdata);
                  poVar7 = std::operator<<(poVar7,"\'");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                  goto LAB_0014c5bb;
                }
                iVar4 = std::istream::get();
                if (iVar4 == -1) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"In file ");
                  poVar7 = std::operator<<(poVar7,local_40);
                  poVar7 = std::operator<<(poVar7,": unexpected end of file.");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  poVar7 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'k\' at fourth byte in track, but found nothing."
                                          );
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                  goto LAB_0014c5bb;
                }
                if (iVar4 != 0x6b) {
                  poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
                  poVar7 = std::operator<<(poVar7,local_40);
                  poVar7 = std::operator<<(poVar7," is not a MIDI file");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  poVar7 = std::operator<<((ostream *)&std::cerr,
                                           "Expecting \'k\' at fourth byte in track but got \'");
                  longdata._0_1_ = (char)iVar4;
                  poVar7 = std::operator<<(poVar7,(char)longdata);
                  poVar7 = std::operator<<(poVar7,"\'");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  this->m_rwstatus = false;
                  this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                  goto LAB_0014c5bb;
                }
                uVar8 = readLittleEndian4Bytes((istream *)filename.field_2._8_8_);
                ppMVar10 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)local_d8);
                iStack_60 = (int)uVar8;
                MidiEventList::reserve(*ppMVar10,iStack_60 / 2);
                ppMVar10 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                           ::operator[](&this->m_events,(long)local_d8);
                MidiEventList::clear(*ppMVar10);
                local_dc = 0;
                while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
                  uVar8 = readVLValue(this,(istream *)filename.field_2._8_8_);
                  iStack_60 = (int)uVar8;
                  local_dc = local_dc + iStack_60;
                  iVar4 = extractMidiData(this,(istream *)filename.field_2._8_8_,
                                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &i,(uchar *)((long)&event.m_eventlink + 3));
                  if (iVar4 == 0) {
                    this->m_rwstatus = false;
                    this_local._7_1_ = (bool)(this->m_rwstatus & 1);
                    goto LAB_0014c5bb;
                  }
                  MidiMessage::setMessage
                            ((MidiMessage *)
                             &bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
                  event.super_MidiMessage.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ = local_d8;
                  event.super_MidiMessage.
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_4_ = local_dc;
                  pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,0
                                      );
                  if ((*pvVar12 == 0xff) &&
                     (pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &i,1), *pvVar12 == '/')) {
                    ppMVar10 = std::
                               vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                               operator[](&this->m_events,(long)local_d8);
                    MidiEventList::push_back
                              (*ppMVar10,
                               (MidiEvent *)
                               &bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                    break;
                  }
                  ppMVar10 = std::
                             vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::
                             operator[](&this->m_events,(long)local_d8);
                  MidiEventList::push_back
                            (*ppMVar10,
                             (MidiEvent *)
                             &bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
                }
              }
              this->m_theTimeState = 1;
              markSequence(this);
              this_local._7_1_ = (bool)(this->m_rwstatus & 1);
LAB_0014c5bb:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
              MidiEvent::~MidiEvent
                        ((MidiEvent *)
                         &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cerr,
                                       "Error: Type 0 MIDI file can only contain one track");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              poVar7 = std::operator<<((ostream *)&std::cerr,"Instead track count is: ");
              pvVar9 = (void *)std::ostream::operator<<(poVar7,uVar3);
              std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
              this->m_rwstatus = false;
              this_local._7_1_ = (bool)(this->m_rwstatus & 1);
            }
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
            poVar7 = std::operator<<(poVar7,local_40);
            poVar7 = std::operator<<(poVar7," is not a MIDI 1.0 Standard MIDI file.");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            poVar7 = std::operator<<((ostream *)&std::cerr,"The header size is ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar8);
            poVar7 = std::operator<<(poVar7," bytes.");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            this->m_rwstatus = false;
            this_local._7_1_ = (bool)(this->m_rwstatus & 1);
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
          poVar7 = std::operator<<(poVar7,local_40);
          poVar7 = std::operator<<(poVar7," is not a MIDI file");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<((ostream *)&std::cerr,"Expecting \'d\' at fourth byte but got \'"
                                  );
          longdata._0_1_ = (char)iVar4;
          poVar7 = std::operator<<(poVar7,(char)longdata);
          poVar7 = std::operator<<(poVar7,"\'");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          this->m_rwstatus = false;
          this_local._7_1_ = (bool)(this->m_rwstatus & 1);
        }
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
        poVar7 = std::operator<<(poVar7,local_40);
        poVar7 = std::operator<<(poVar7," is not a MIDI file");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        poVar7 = std::operator<<((ostream *)&std::cerr,"Expecting \'h\' at third byte but got \'");
        longdata._0_1_ = (char)iVar4;
        poVar7 = std::operator<<(poVar7,(char)longdata);
        poVar7 = std::operator<<(poVar7,"\'");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        this->m_rwstatus = false;
        this_local._7_1_ = (bool)(this->m_rwstatus & 1);
      }
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar7 = std::operator<<(poVar7,local_40);
      poVar7 = std::operator<<(poVar7," is not a MIDI file");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<((ostream *)&std::cerr,"Expecting \'T\' at second byte but got \'");
      longdata._0_1_ = (char)iVar4;
      poVar7 = std::operator<<(poVar7,(char)longdata);
      poVar7 = std::operator<<(poVar7,"\'");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      this->m_rwstatus = false;
      this_local._7_1_ = (bool)(this->m_rwstatus & 1);
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"File ");
    poVar7 = std::operator<<(poVar7,local_40);
    poVar7 = std::operator<<(poVar7," is not a MIDI file");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cerr,"Expecting \'M\' at first byte but got \'");
    longdata._0_1_ = (char)iVar4;
    poVar7 = std::operator<<(poVar7,(char)longdata);
    poVar7 = std::operator<<(poVar7,"\'");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    this->m_rwstatus = false;
    this_local._7_1_ = (bool)(this->m_rwstatus & 1);
  }
LAB_0014c5d3:
  std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool MidiFile::readSmf(std::istream& input) {
	m_rwstatus = true;

	std::string filename = getFilename();

	int    character;
	// uchar  buffer[123456] = {0};
	ulong  longdata;
	ushort shortdata;

	// Read the MIDI header (4 bytes of ID, 4 byte data size,
	// anticipated 6 bytes of data.

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'M' at first byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'M') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'M' at first byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'T' at second byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'T') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'T' at second byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'h' at third byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'h') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'h' at third byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	character = input.get();
	if (character == EOF) {
		std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
		std::cerr << "Expecting 'd' at fourth byte, but found nothing." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else if (character != 'd') {
		std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
		std::cerr << "Expecting 'd' at fourth byte but got '"
		     << (char)character << "'" << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// read header size (allow larger header size?)
	longdata = readLittleEndian4Bytes(input);
	if (longdata != 6) {
		std::cerr << "File " << filename
		     << " is not a MIDI 1.0 Standard MIDI file." << std::endl;
		std::cerr << "The header size is " << longdata << " bytes." << std::endl;
		m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #1: format type
	int type;
	shortdata = readLittleEndian2Bytes(input);
	switch (shortdata) {
		case 0:
			type = 0;
			break;
		case 1:
			type = 1;
			break;
		case 2:
			// Type-2 MIDI files should probably be allowed as well,
			// but I have never seen one in the wild to test with.
		default:
			std::cerr << "Error: cannot handle a type-" << shortdata
			     << " MIDI file" << std::endl;
			m_rwstatus = false; return m_rwstatus;
	}

	// Header parameter #2: track count
	int tracks;
	shortdata = readLittleEndian2Bytes(input);
	if (type == 0 && shortdata != 1) {
		std::cerr << "Error: Type 0 MIDI file can only contain one track" << std::endl;
		std::cerr << "Instead track count is: " << shortdata << std::endl;
		m_rwstatus = false; return m_rwstatus;
	} else {
		tracks = shortdata;
	}
	clear();
	if (m_events[0] != NULL) {
		delete m_events[0];
	}
	m_events.resize(tracks);
	for (int z=0; z<tracks; z++) {
		m_events[z] = new MidiEventList;
		m_events[z]->reserve(10000);   // Initialize with 10,000 event storage.
		m_events[z]->clear();
	}

	// Header parameter #3: Ticks per quarter note
	shortdata = readLittleEndian2Bytes(input);
	if (shortdata >= 0x8000) {
		int framespersecond = 255 - ((shortdata >> 8) & 0x00ff) + 1;
		int subframes       = shortdata & 0x00ff;
		switch (framespersecond) {
			case 25:  framespersecond = 25; break;
			case 24:  framespersecond = 24; break;
			case 29:  framespersecond = 29; break;  // really 29.97 for color television
			case 30:  framespersecond = 30; break;
			default:
					std::cerr << "Warning: unknown FPS: " << framespersecond << std::endl;
					std::cerr << "Using non-standard FPS: " << framespersecond << std::endl;
		}
		m_ticksPerQuarterNote = framespersecond * subframes;

		// std::cerr << "SMPTE ticks: " << m_ticksPerQuarterNote << " ticks/sec" << std::endl;
		// std::cerr << "SMPTE frames per second: " << framespersecond << std::endl;
		// std::cerr << "SMPTE subframes per frame: " << subframes << std::endl;
	}  else {
		m_ticksPerQuarterNote = shortdata;
	}


	//////////////////////////////////////////////////
	//
	// now read individual tracks:
	//

	uchar runningCommand;
	MidiEvent event;
	std::vector<uchar> bytes;
	int xstatus;

	for (int i=0; i<tracks; i++) {
		runningCommand = 0;

		// std::cout << "\nReading Track: " << i + 1 << flush;

		// read track header...

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'M' at first byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'M') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'M' at first byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'T' at second byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'T') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'T' at second byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'r' at third byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'r') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'r' at third byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		character = input.get();
		if (character == EOF) {
			std::cerr << "In file " << filename << ": unexpected end of file." << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track, but found nothing."
			     << std::endl;
			m_rwstatus = false; return m_rwstatus;
		} else if (character != 'k') {
			std::cerr << "File " << filename << " is not a MIDI file" << std::endl;
			std::cerr << "Expecting 'k' at fourth byte in track but got '"
			     << (char)character << "'" << std::endl;
			m_rwstatus = false; return m_rwstatus;
		}

		// Now read track chunk size and throw it away because it is
		// not really necessary since the track MUST end with an
		// end of track meta event, and many MIDI files found in the wild
		// do not correctly give the track size.
		longdata = readLittleEndian4Bytes(input);

		// Set the size of the track allocation so that it might
		// approximately fit the data.
		m_events[i]->reserve((int)longdata/2);
		m_events[i]->clear();

		// Read MIDI events in the track, which are pairs of VLV values
		// and then the bytes for the MIDI message.  Running status messages
		// will be filled in with their implicit command byte.
		// The timestamps are converted from delta ticks to absolute ticks,
		// with the absticks variable accumulating the VLV tick values.
		int absticks = 0;
		while (!input.eof()) {
			longdata = readVLValue(input);
			absticks += longdata;
			xstatus = extractMidiData(input, bytes, runningCommand);
			if (xstatus == 0) {
				m_rwstatus = false; return m_rwstatus;
			}
			event.setMessage(bytes);
			event.tick = absticks;
			event.track = i;

			if (bytes[0] == 0xff && bytes[1] == 0x2f) {
				// end-of-track message
				// comment out the following line if you don't want to see the
				// end of track message (which is always required, and will added
				// automatically when a MIDI is written, so it is not necessary.
				m_events[i]->push_back(event);
				break;
			}
			m_events[i]->push_back(event);
		}
	}

	m_theTimeState = TIME_STATE_ABSOLUTE;

	// The original order of the MIDI events is marked with an enumeration which
	// allows for reconstruction of the order when merging/splitting tracks to/from
	// a type-0 configuration.
	markSequence();

	return m_rwstatus;
}